

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O2

char * cht_Morph(player_t *player,PClassPlayerPawn *morphclass,bool quickundo)

{
  bool bVar1;
  PClassPlayerPawn *pPVar2;
  int style;
  char *pcVar3;
  
  if (player->mo == (APlayerPawn *)0x0) {
    return (char *)"";
  }
  pPVar2 = (PClassPlayerPawn *)DObject::GetClass((DObject *)player->mo);
  style = (uint)(gameinfo.gametype == GAME_Hexen) * 8 + 4;
  if (player->morphTics == 0) {
    bVar1 = P_MorphPlayer(player,player,morphclass,0,style,(PClassActor *)0x0,(PClassActor *)0x0);
    if (!bVar1) {
      return (char *)"";
    }
    pcVar3 = "TXT_STRANGE";
  }
  else {
    bVar1 = P_UndoPlayerMorph(player,player,0,false);
    if (!bVar1) {
      return (char *)"";
    }
    if ((pPVar2 == morphclass || quickundo) ||
       (bVar1 = P_MorphPlayer(player,player,morphclass,0,style,(PClassActor *)0x0,(PClassActor *)0x0
                             ), !bVar1)) {
      pcVar3 = "TXT_NOTSTRANGE";
    }
    else {
      pcVar3 = "TXT_STRANGER";
    }
  }
  pcVar3 = FStringTable::operator()(&GStrings,pcVar3);
  return pcVar3;
}

Assistant:

const char *cht_Morph (player_t *player, PClassPlayerPawn *morphclass, bool quickundo)
{
	if (player->mo == NULL)
	{
		return "";
	}
	PClassPlayerPawn *oldclass = player->mo->GetClass();

	// Set the standard morph style for the current game
	int style = MORPH_UNDOBYTOMEOFPOWER;
	if (gameinfo.gametype == GAME_Hexen) style |= MORPH_UNDOBYCHAOSDEVICE;

	if (player->morphTics)
	{
		if (P_UndoPlayerMorph (player, player))
		{
			if (!quickundo && oldclass != morphclass && P_MorphPlayer (player, player, morphclass, 0, style))
			{
				return GStrings("TXT_STRANGER");
			}
			return GStrings("TXT_NOTSTRANGE");
		}
	}
	else if (P_MorphPlayer (player, player, morphclass, 0, style))
	{
		return GStrings("TXT_STRANGE");
	}
	return "";
}